

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstr.hpp
# Opt level: O0

void __thiscall zstr::ifstream::ifstream(ifstream *this)

{
  undefined8 *in_RDI;
  int in_stack_00000048;
  bool in_stack_0000004f;
  size_t in_stack_00000050;
  streambuf *in_stack_00000058;
  istreambuf *in_stack_00000060;
  strict_fstream_holder<strict_fstream::ifstream> *in_stack_ffffffffffffffd0;
  
  std::ios::ios(in_RDI + 0x43);
  memset(in_RDI + 2,0,0x208);
  detail::strict_fstream_holder<strict_fstream::ifstream>::strict_fstream_holder
            (in_stack_ffffffffffffffd0);
  *in_RDI = 0x96d0e0;
  in_RDI[0x43] = 0x96d108;
  operator_new(0x80);
  std::ifstream::rdbuf();
  istreambuf::istreambuf
            (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_0000004f,
             in_stack_00000048);
  std::istream::istream(in_RDI,(streambuf *)&PTR_construction_vtable_24__0096d120);
  *in_RDI = 0x96d0e0;
  in_RDI[0x43] = 0x96d108;
  return;
}

Assistant:

explicit ifstream()
      : detail::strict_fstream_holder<strict_fstream::ifstream>(),
        std::istream(new istreambuf(_fs.rdbuf())) {}